

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

SOURCE_HANDLE source_clone(SOURCE_HANDLE value)

{
  SOURCE_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (SOURCE_HANDLE)malloc(8);
  if (__ptr != (SOURCE_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (SOURCE_HANDLE)0x0;
}

Assistant:

SOURCE_HANDLE source_clone(SOURCE_HANDLE value)
{
    SOURCE_INSTANCE* source_instance = (SOURCE_INSTANCE*)malloc(sizeof(SOURCE_INSTANCE));
    if (source_instance != NULL)
    {
        source_instance->composite_value = amqpvalue_clone(((SOURCE_INSTANCE*)value)->composite_value);
        if (source_instance->composite_value == NULL)
        {
            free(source_instance);
            source_instance = NULL;
        }
    }

    return source_instance;
}